

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O0

uint64_t __thiscall
MILBlob::Blob::StorageWriter::Impl::WriteData<unsigned_int>
          (Impl *this,Span<const_unsigned_int,_18446744073709551615UL> data)

{
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  Span<const_unsigned_int,_18446744073709551615UL> data_01;
  size_t numElements;
  pointer pFVar1;
  runtime_error *prVar2;
  SpanSize<18446744073709551615UL> extraout_RDX;
  Span<const_unsigned_int,_18446744073709551615UL> span;
  Span<unsigned_char,_18446744073709551615UL> local_120;
  Span<const_unsigned_char,_18446744073709551615UL> local_110;
  pointer local_100;
  pointer local_f8;
  uint64_t local_f0;
  uint64_t actualDataOffset;
  pointer local_e0;
  Span<const_unsigned_char,_18446744073709551615UL> local_d8;
  undefined1 local_c8 [8];
  Span<const_unsigned_char,_18446744073709551615UL> byteSpan;
  Span<const_unsigned_char,_18446744073709551615UL> local_a8;
  uint64_t local_98;
  uint64_t actualMetadataOffset;
  ulong local_80;
  unsigned_long dataOffset;
  uint64_t metadataOffset;
  pointer local_68;
  undefined1 local_60 [8];
  blob_metadata metadata;
  Impl *this_local;
  Span<const_unsigned_int,_18446744073709551615UL> data_local;
  
  data_local.m_ptr = (pointer)data.m_size.m_size;
  this_local = (Impl *)data.m_ptr;
  metadata.reserved_4 = (uint64_t)this;
  blob_metadata::blob_metadata((blob_metadata *)local_60);
  local_60._4_4_ = UInt32;
  metadataOffset = (uint64_t)this_local;
  local_68 = data_local.m_ptr;
  data_01.m_size.m_size = (size_t)data_local.m_ptr;
  data_01.m_ptr = (pointer)this_local;
  metadata._0_8_ = SpanSizeInBytes<unsigned_int>(data_01);
  numElements = Util::Span<const_unsigned_int,_18446744073709551615UL>::Size
                          ((Span<const_unsigned_int,_18446744073709551615UL> *)&this_local);
  WritePaddingBits<unsigned_int>((blob_metadata *)local_60,numElements);
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  dataOffset = FileWriter::GetNextAlignedOffset(pFVar1);
  local_80 = dataOffset + 0x40;
  if ((local_80 & 0x3f) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  metadata.sizeInBytes = local_80;
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  join_0x00000010_0x00000000_ =
       anon_unknown.dwarf_4473ea::CastAndMakeSpan<MILBlob::Blob::blob_metadata>
                 ((blob_metadata *)local_60);
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_a8,(Span<unsigned_char,_18446744073709551615UL> *)&byteSpan.m_size);
  local_98 = FileWriter::AppendData(pFVar1,local_a8);
  if (dataOffset != local_98) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: Metadata written to different offset than expected.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
            ((Span<const_unsigned_char,_18446744073709551615UL> *)local_c8);
  actualDataOffset = (uint64_t)this_local;
  local_e0 = data_local.m_ptr;
  span.m_size.m_size = extraout_RDX.m_size;
  span.m_ptr = data_local.m_ptr;
  local_d8 = Util::SpanCast<unsigned_char_const,unsigned_int_const>((Util *)this_local,span);
  local_c8 = (undefined1  [8])local_d8.m_ptr;
  byteSpan.m_ptr = (pointer)local_d8.m_size.m_size;
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  local_100 = (pointer)local_c8;
  local_f8 = byteSpan.m_ptr;
  data_00.m_size.m_size = (size_t)byteSpan.m_ptr;
  data_00.m_ptr = (pointer)local_c8;
  local_f0 = FileWriter::AppendData(pFVar1,data_00);
  if (local_80 != local_f0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"[MIL StorageWriter]: Metadata written to different offset than expected.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (this->m_header).count = (this->m_header).count + 1;
  pFVar1 = std::
           unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
           operator->(&this->m_fileWriter);
  local_120 = anon_unknown.dwarf_4473ea::CastAndMakeSpan<MILBlob::Blob::storage_header>
                        (&this->m_header);
  Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_110,&local_120);
  FileWriter::WriteData(pFVar1,local_110,0);
  return dataOffset;
}

Assistant:

uint64_t StorageWriter::Impl::WriteData(Util::Span<const T> data)
{
    // 1. Write data
    blob_metadata metadata;
    metadata.mil_dtype = BlobDataTypeTraits<typename std::remove_const<T>::type>::DataType;
    metadata.sizeInBytes = SpanSizeInBytes(data);

    // populate padding_size_in_bits, if we're writing a sub-byte-sized type
    WritePaddingBits<std::remove_cv_t<T>>(metadata, data.Size());

    // Get offset for data
    auto metadataOffset = m_fileWriter->GetNextAlignedOffset();
    // metadata is 64 bit aligned.
    auto dataOffset = metadataOffset + sizeof(metadata);
    MILVerifyIsTrue(dataOffset % DefaultStorageAlignment == 0,
                    std::runtime_error,
                    "[MIL StorageWriter]: dataOffset is expected to be 64 bits aligned.");
    metadata.offset = dataOffset;
    // We don't expect m_fileWriter to produce different offset for metadata and data
    auto actualMetadataOffset = m_fileWriter->AppendData(CastAndMakeSpan(metadata));
    MILVerifyIsTrue(metadataOffset == actualMetadataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");
    Util::Span<const uint8_t> byteSpan;
    if constexpr (MILBlob::IsSubByteSized<T>::value) {
        byteSpan = Util::CastFromBitSpan(data);
    } else {
        byteSpan = Util::SpanCast<const uint8_t>(data);
    }
    auto actualDataOffset = m_fileWriter->AppendData(byteSpan);
    MILVerifyIsTrue(dataOffset == actualDataOffset,
                    std::runtime_error,
                    "[MIL StorageWriter]: Metadata written to different offset than expected.");

    // 2. Update count in header
    m_header.count++;
    // Write header with new count
    m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
    // return offset in file to blob_metadata
    return metadataOffset;
}